

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regr_r2.cpp
# Opt level: O2

AggregateFunction * duckdb::RegrR2Fun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  LogicalType *in_R8;
  LogicalType aLStack_58 [24];
  LogicalType local_40 [24];
  
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd8,DOUBLE);
  duckdb::LogicalType::LogicalType(local_40,DOUBLE);
  duckdb::LogicalType::LogicalType(aLStack_58,DOUBLE);
  AggregateFunction::
  BinaryAggregate<duckdb::RegrR2State,double,double,double,duckdb::RegrR2Operation,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffd8,local_40,aLStack_58,in_R8);
  duckdb::LogicalType::~LogicalType(aLStack_58);
  duckdb::LogicalType::~LogicalType(local_40);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd8);
  return in_RDI;
}

Assistant:

AggregateFunction RegrR2Fun::GetFunction() {
	return AggregateFunction::BinaryAggregate<RegrR2State, double, double, double, RegrR2Operation>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE);
}